

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  Filter *pFVar1;
  bool bVar2;
  Filter *this_00;
  long lVar3;
  Filter *pFVar4;
  long lVar5;
  
  this_00 = (this->m_filters).
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->m_filters).
           super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pFVar1 - (long)this_00;
  for (lVar3 = lVar5 / 0x18 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = Filter::matches(this_00,testCase);
    pFVar4 = this_00;
    if (bVar2) goto LAB_0011f98b;
    bVar2 = Filter::matches(this_00 + 1,testCase);
    pFVar4 = this_00 + 1;
    if (bVar2) goto LAB_0011f98b;
    bVar2 = Filter::matches(this_00 + 2,testCase);
    pFVar4 = this_00 + 2;
    if (bVar2) goto LAB_0011f98b;
    bVar2 = Filter::matches(this_00 + 3,testCase);
    pFVar4 = this_00 + 3;
    if (bVar2) goto LAB_0011f98b;
    this_00 = this_00 + 4;
    lVar5 = lVar5 + -0x60;
  }
  lVar5 = lVar5 / 0x18;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pFVar4 = pFVar1;
      if ((lVar5 != 3) || (bVar2 = Filter::matches(this_00,testCase), pFVar4 = this_00, bVar2))
      goto LAB_0011f98b;
      this_00 = this_00 + 1;
    }
    bVar2 = Filter::matches(this_00,testCase);
    pFVar4 = this_00;
    if (bVar2) goto LAB_0011f98b;
    this_00 = this_00 + 1;
  }
  bVar2 = Filter::matches(this_00,testCase);
  pFVar4 = this_00;
  if (!bVar2) {
    pFVar4 = pFVar1;
  }
LAB_0011f98b:
  return pFVar4 != pFVar1;
}

Assistant:

bool TestSpec::matches( TestCaseInfo const& testCase ) const {
        return std::any_of( m_filters.begin(), m_filters.end(), [&]( Filter const& f ){ return f.matches( testCase ); } );
    }